

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

bool_t prf_group_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int iVar1;
  bfile_t *in_RDX;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict2 *data;
  int pos;
  uint32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar3;
  
  if (*in_RDI == prf_group_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_write(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (uint)((ulong)in_RDI >> 0x20));
    iVar2 = iVar2 + 8;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = iVar2 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = iVar2 + 2;
    bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
    iVar2 = iVar2 + 4;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = iVar2 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = iVar2 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar2 = iVar2 + 2;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar2 >> 0x18));
    iVar2 = iVar2 + 1;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar2 >> 0x18));
    iVar1 = iVar2 + 1;
    if (iVar2 + 5 <= (int)(uint)in_RDI[1]) {
      bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar1 = iVar1 + 4;
    }
    if (iVar1 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar3 = 1;
  }
  else {
    prf_error(3,"tried group save method on node of type %d.",(ulong)*in_RDI);
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_group_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_group_info.opcode ) {
        prf_error( 3, "tried group save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_int16_be( bfile, data->reserved1 ); pos += 2;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        bf_put_int16_be( bfile, data->special_effect_id1 ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id2 ); pos += 2;
        bf_put_int16_be( bfile, data->significance ); pos += 2;
        bf_put_int8( bfile, data->layer_code ); pos += 1;
        bf_put_int8( bfile, data->reserved2 ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3 ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}